

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_unk90(envy_bios *bios)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  envy_bios_power_unk90 *peVar5;
  envy_bios_power_unk90_entry *peVar6;
  uint32_t data;
  int err;
  int i;
  envy_bios_power_unk90 *unk90;
  envy_bios *bios_local;
  
  peVar5 = &(bios->power).unk90;
  if (peVar5->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar5->offset,&(bios->power).unk90.version);
    uVar1 = (bios->power).unk90.version;
    if ((uVar1 == '\x10') || (uVar1 == ' ')) {
      iVar2 = bios_u8(bios,peVar5->offset + 1,&(bios->power).unk90.hlen);
      iVar3 = bios_u8(bios,peVar5->offset + 2,&(bios->power).unk90.rlen);
      iVar4 = bios_u8(bios,peVar5->offset + 3,&(bios->power).unk90.entriesnum);
      (bios->power).unk90.valid = ((iVar4 != 0 || (iVar3 != 0 || iVar2 != 0)) ^ 0xffU) & 1;
      peVar6 = (envy_bios_power_unk90_entry *)malloc((ulong)(bios->power).unk90.entriesnum << 2);
      (bios->power).unk90.entries = peVar6;
      for (data = 0; (int)data < (int)(uint)(bios->power).unk90.entriesnum; data = data + 1) {
        (bios->power).unk90.entries[(int)data].offset =
             peVar5->offset + (uint)(bios->power).unk90.hlen + data * (bios->power).unk90.rlen;
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown LOW POWER PSI table version 0x%x\n",
              (ulong)(bios->power).unk90.version);
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_unk90(struct envy_bios *bios) {
	struct envy_bios_power_unk90 *unk90 = &bios->power.unk90;
	int i, err = 0;

	if (!unk90->offset)
		return -EINVAL;

	bios_u8(bios, unk90->offset + 0x0, &unk90->version);
	switch(unk90->version) {
	case 0x10:
	case 0x20:
		err |= bios_u8(bios, unk90->offset + 0x1, &unk90->hlen);
		err |= bios_u8(bios, unk90->offset + 0x2, &unk90->rlen);
		err |= bios_u8(bios, unk90->offset + 0x3, &unk90->entriesnum);
		unk90->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown LOW POWER PSI table version 0x%x\n", unk90->version);
		return -EINVAL;
	};

	err = 0;
	unk90->entries = malloc(unk90->entriesnum * sizeof(struct envy_bios_power_unk90_entry));
	for (i = 0; i < unk90->entriesnum; i++) {
		uint32_t data = unk90->offset + unk90->hlen + i * unk90->rlen;

		unk90->entries[i].offset = data;
	}

	return 0;
}